

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O0

void mbedtls_mpi_core_shift_r(mbedtls_mpi_uint *X,size_t limbs,size_t count)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong in_RDX;
  ulong in_RSI;
  void *in_RDI;
  mbedtls_mpi_uint r1;
  mbedtls_mpi_uint r0;
  size_t v1;
  size_t v0;
  size_t i;
  ulong local_38;
  ulong local_20;
  
  local_38 = 0;
  uVar2 = in_RDX >> 6;
  uVar3 = in_RDX & 0x3f;
  if ((in_RSI < uVar2) || ((uVar2 == in_RSI && (uVar3 != 0)))) {
    memset(in_RDI,0,in_RSI << 3);
  }
  else {
    if (uVar2 != 0) {
      for (local_20 = 0; local_20 < in_RSI - uVar2; local_20 = local_20 + 1) {
        *(undefined8 *)((long)in_RDI + local_20 * 8) =
             *(undefined8 *)((long)in_RDI + (local_20 + uVar2) * 8);
      }
      for (; local_20 < in_RSI; local_20 = local_20 + 1) {
        *(undefined8 *)((long)in_RDI + local_20 * 8) = 0;
      }
    }
    local_20 = in_RSI;
    if (uVar3 != 0) {
      for (; local_20 != 0; local_20 = local_20 - 1) {
        lVar1 = *(long *)((long)in_RDI + (local_20 - 1) * 8);
        *(ulong *)((long)in_RDI + (local_20 - 1) * 8) =
             *(ulong *)((long)in_RDI + (local_20 - 1) * 8) >> (sbyte)uVar3;
        *(ulong *)((long)in_RDI + (local_20 - 1) * 8) =
             local_38 | *(ulong *)((long)in_RDI + (local_20 - 1) * 8);
        local_38 = lVar1 << (0x40U - (sbyte)uVar3 & 0x3f);
      }
    }
  }
  return;
}

Assistant:

void mbedtls_mpi_core_shift_r(mbedtls_mpi_uint *X, size_t limbs,
                              size_t count)
{
    size_t i, v0, v1;
    mbedtls_mpi_uint r0 = 0, r1;

    v0 = count /  biL;
    v1 = count & (biL - 1);

    if (v0 > limbs || (v0 == limbs && v1 > 0)) {
        memset(X, 0, limbs * ciL);
        return;
    }

    /*
     * shift by count / limb_size
     */
    if (v0 > 0) {
        for (i = 0; i < limbs - v0; i++) {
            X[i] = X[i + v0];
        }

        for (; i < limbs; i++) {
            X[i] = 0;
        }
    }

    /*
     * shift by count % limb_size
     */
    if (v1 > 0) {
        for (i = limbs; i > 0; i--) {
            r1 = X[i - 1] << (biL - v1);
            X[i - 1] >>= v1;
            X[i - 1] |= r0;
            r0 = r1;
        }
    }
}